

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::CuriosityPart::CalcMassProperties(CuriosityPart *this,double density)

{
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_col;
  double vol;
  string mesh_filename;
  ChVector<double> cog_pos;
  ChMatrix33<double> cog_rot;
  ChFrame<double> local_140;
  double local_b8;
  double dStack_b0;
  double local_a8;
  ChMatrix33<double> inertia;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cog_rot,
                 "robot/curiosity/col/",&this->m_mesh_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cog_rot,
                 ".obj");
  chrono::GetChronoDataFile((string *)&mesh_filename);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&cog_rot);
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&trimesh_col,SUB81(&mesh_filename,0),false);
  local_b8 = (this->m_mesh_xform).coord.pos.m_data[0];
  dStack_b0 = (this->m_mesh_xform).coord.pos.m_data[1];
  local_a8 = (this->m_mesh_xform).coord.pos.m_data[2];
  (**(code **)(*(long *)trimesh_col.
                        super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x80))();
  chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
  cog_pos.m_data[2] = 0.0;
  cog_pos.m_data[0] = 0.0;
  cog_pos.m_data[1] = 0.0;
  chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
            ((bool)trimesh_col.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr._0_1_,(double *)0x1,(ChVector *)&vol,(ChMatrix33 *)&cog_pos);
  ChInertiaUtils::PrincipalInertia(&inertia,&this->m_inertia,&cog_rot);
  this->m_mass = density * vol;
  ChVector<double>::operator*=(&this->m_inertia,density);
  ChFrame<double>::ChFrame(&local_140,&cog_pos,&cog_rot);
  ChFrame<double>::operator=(&this->m_cog,&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh_col.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&mesh_filename);
  return;
}

Assistant:

void CuriosityPart::CalcMassProperties(double density) {
    auto mesh_filename = GetChronoDataFile("robot/curiosity/col/" + m_mesh_name + ".obj");
    auto trimesh_col = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(mesh_filename, false, false);
    trimesh_col->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
    trimesh_col->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

    double vol;
    ChVector<> cog_pos;
    ChMatrix33<> cog_rot;
    ChMatrix33<> inertia;
    trimesh_col->ComputeMassProperties(true, vol, cog_pos, inertia);
    ChInertiaUtils::PrincipalInertia(inertia, m_inertia, cog_rot);
    m_mass = density * vol;
    m_inertia *= density;
    m_cog = ChFrame<>(cog_pos, cog_rot);
}